

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_2;
  uchar *puVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  byte *__src;
  byte *__dest;
  Fault f;
  size_t size;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  uchar *local_18;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  params_2 = &this->fillPos;
  __dest = this->fillPos;
  puVar1 = (this->array).ptr;
  sVar2 = (this->array).size_;
  size = (size_t)__buf;
  if ((__dest == __src) &&
     (_kjCondition.right = (unsigned_long)(puVar1 + (sVar2 - (long)__src)),
     (uchar *)_kjCondition.right != (uchar *)0x0)) {
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right >= __buf;
    if (_kjCondition.right < __buf) {
      local_18 = (uchar *)_kjCondition.right;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x116,FAILED,"size <= array.end() - fillPos",
                 "_kjCondition,size, fillPos, array.end() - fillPos",
                 (DebugComparison<unsigned_long_&,_long> *)&_kjCondition,_kjCondition.left,params_2,
                 (long *)&local_18);
      _::Debug::Fault::fatal(&f);
    }
  }
  else {
    _kjCondition.right = (unsigned_long)(puVar1 + (sVar2 - (long)__dest));
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right >= __buf;
    if (_kjCondition.right < __buf) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[77]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x11a,FAILED,"size <= (size_t)(array.end() - fillPos)",
                 "_kjCondition,\"ArrayOutputStream\'s backing array was not large enough for the data written.\""
                 ,&_kjCondition,
                 (char (*) [77])
                 "ArrayOutputStream\'s backing array was not large enough for the data written.");
      _::Debug::Fault::fatal(&f);
    }
    _kjCondition.left = (unsigned_long *)memcpy(__dest,__src,(size_t)__buf);
    __dest = *params_2;
  }
  *params_2 = __dest + (long)__buf;
  return (ssize_t)_kjCondition.left;
}

Assistant:

void ArrayOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}